

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_subset_format(bcf_hdr_t *hdr,bcf1_t *rec)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  bcf_fmt_t *pbVar4;
  long lVar5;
  uint8_t *ptr;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint8_t *__dest;
  uint8_t *puVar9;
  
  if (hdr->keep_samples != (uint8_t *)0x0) {
    if (hdr->n[2] == 0) {
      *(uint *)&rec->field_0x14 = (uint)(byte)rec->field_0x14;
      (rec->indiv).l = 0;
    }
    else {
      ptr = (uint8_t *)(rec->indiv).s;
      if ((rec->d).m_fmt < (int)(uint)(byte)rec->field_0x14) {
        uVar3 = (byte)rec->field_0x14 - 1;
        uVar3 = (int)uVar3 >> 1 | uVar3;
        uVar3 = (int)uVar3 >> 2 | uVar3;
        uVar3 = (int)uVar3 >> 4 | uVar3;
        uVar3 = (int)uVar3 >> 8 | uVar3;
        uVar3 = (int)uVar3 >> 0x10 | uVar3;
        (rec->d).m_fmt = uVar3 + 1;
        pbVar4 = (bcf_fmt_t *)realloc((rec->d).fmt,(long)(int)uVar3 * 0x20 + 0x20);
        (rec->d).fmt = pbVar4;
      }
      lVar5 = 0x1c;
      for (lVar6 = 0; lVar6 < (rec->d).m_fmt; lVar6 = lVar6 + 1) {
        puVar1 = (uint *)((long)&((rec->d).fmt)->id + lVar5);
        *puVar1 = *puVar1 & 0x7fffffff;
        lVar5 = lVar5 + 0x20;
      }
      __dest = (uint8_t *)0x0;
      for (uVar8 = 0; uVar7 = *(ulong *)&rec->field_0x10, uVar8 < (uVar7 >> 0x20 & 0xff);
          uVar8 = uVar8 + 1) {
        ptr = bcf_unpack_fmt_core1(ptr,(uint)(uVar7 >> 0x28),(rec->d).fmt + uVar8);
        pbVar4 = (rec->d).fmt;
        puVar9 = pbVar4[uVar8].p;
        iVar2 = pbVar4[uVar8].size;
        if (__dest != (uint8_t *)0x0) {
          uVar7 = (ulong)*(uint *)&pbVar4[uVar8].field_0x1c & 0x7fffffff;
          memmove(pbVar4[uVar8 - 1].p + pbVar4[uVar8 - 1].p_len,puVar9 + -uVar7,uVar7);
          pbVar4 = (rec->d).fmt;
          pbVar4[uVar8].p =
               pbVar4[uVar8 - 1].p +
               ((ulong)*(uint *)&pbVar4[uVar8].field_0x1c & 0x7fffffff) +
               (ulong)pbVar4[uVar8 - 1].p_len;
        }
        puVar9 = puVar9 + -(long)iVar2;
        __dest = pbVar4[uVar8].p;
        for (uVar3 = 0; (int)uVar3 < hdr->nsamples_ori; uVar3 = uVar3 + 1) {
          puVar9 = puVar9 + pbVar4[uVar8].size;
          if ((hdr->keep_samples[uVar3 >> 3] >> (uVar3 & 7) & 1) != 0) {
            memmove(__dest,puVar9,(long)pbVar4[uVar8].size);
            pbVar4 = (rec->d).fmt;
            __dest = __dest + pbVar4[uVar8].size;
          }
        }
        puVar9 = pbVar4[uVar8].p;
        (rec->indiv).l = (size_t)(__dest + ((rec->indiv).l - (long)(puVar9 + pbVar4[uVar8].p_len)));
        pbVar4[uVar8].p_len = (int)__dest - (int)puVar9;
      }
      *(byte *)&rec->unpacked = (byte)rec->unpacked | 8;
      *(ulong *)&rec->field_0x10 = uVar7 & 0xffffffffff | (ulong)(uint)hdr->n[2] << 0x28;
    }
  }
  return 0;
}

Assistant:

int bcf_subset_format(const bcf_hdr_t *hdr, bcf1_t *rec)
{
    if ( !hdr->keep_samples ) return 0;
    if ( !bcf_hdr_nsamples(hdr) )
    {
        rec->indiv.l = rec->n_sample = 0;
        return 0;
    }

    int i, j;
    uint8_t *ptr = (uint8_t*)rec->indiv.s, *dst = NULL, *src;
    bcf_dec_t *dec = &rec->d;
    hts_expand(bcf_fmt_t, rec->n_fmt, dec->m_fmt, dec->fmt);
    for (i=0; i<dec->m_fmt; ++i) dec->fmt[i].p_free = 0;

    for (i=0; i<rec->n_fmt; i++)
    {
        ptr = bcf_unpack_fmt_core1(ptr, rec->n_sample, &dec->fmt[i]);
        src = dec->fmt[i].p - dec->fmt[i].size;
        if ( dst )
        {
            memmove(dec->fmt[i-1].p + dec->fmt[i-1].p_len, dec->fmt[i].p - dec->fmt[i].p_off, dec->fmt[i].p_off);
            dec->fmt[i].p = dec->fmt[i-1].p + dec->fmt[i-1].p_len + dec->fmt[i].p_off;
        }
        dst = dec->fmt[i].p;
        for (j=0; j<hdr->nsamples_ori; j++)
        {
            src += dec->fmt[i].size;
            if ( !bit_array_test(hdr->keep_samples,j) ) continue;
            memmove(dst, src, dec->fmt[i].size);
            dst += dec->fmt[i].size;
        }
        rec->indiv.l -= dec->fmt[i].p_len - (dst - dec->fmt[i].p);
        dec->fmt[i].p_len = dst - dec->fmt[i].p;
    }
    rec->unpacked |= BCF_UN_FMT;

    rec->n_sample = bcf_hdr_nsamples(hdr);
    return 0;
}